

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::FindWindowSettingsByID(ImGuiID id)

{
  int iVar1;
  char *pcVar2;
  ImGuiWindowSettings *pIVar3;
  ImGuiWindowSettings *pIVar4;
  
  pcVar2 = (GImGui->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar4 = (ImGuiWindowSettings *)(pcVar2 + 4);
    pIVar3 = pIVar4;
    do {
      if ((pIVar3->ID == id) && (pIVar3->WantDelete != true)) {
        return pIVar3;
      }
      iVar1._0_1_ = pIVar3[-1].Collapsed;
      iVar1._1_1_ = pIVar3[-1].IsChild;
      iVar1._2_1_ = pIVar3[-1].WantApply;
      iVar1._3_1_ = pIVar3[-1].WantDelete;
      pIVar3 = (ImGuiWindowSettings *)((long)&pIVar3->ID + (long)iVar1);
    } while (pIVar3 != (ImGuiWindowSettings *)
                       ((long)&pIVar4->ID + (long)(GImGui->SettingsWindows).Buf.Size));
  }
  return (ImGuiWindowSettings *)0x0;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id && !settings->WantDelete)
            return settings;
    return NULL;
}